

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O1

void __thiscall
yactfr::internal::JsonStructTypeValReq::_validate(JsonStructTypeValReq *this,JsonVal *jsonVal)

{
  JsonObjValReq::_validate((JsonObjValReq *)this,jsonVal);
  anon_unknown_0::validateUniqueEntryNames(jsonVal,"member-classes","structure member type");
  return;
}

Assistant:

void _validate(const JsonVal& jsonVal) const override
    {
        try {
            JsonDtValReq::_validate(jsonVal);

            // validate that member type names are unique
            validateUniqueEntryNames(jsonVal, strs::memberClss, "structure member type");
        } catch (TextParseError& exc) {
            appendMsgToTextParseError(exc, "Invalid structure type:", jsonVal.loc());
            throw;
        }
    }